

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

float gl4cts::CopyImage::expandFloat(uint compressed,uint numMantissaBits)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  float fVar4;
  uint mantissa;
  uint exponent;
  float retval;
  uint divisor;
  uint numMantissaBits_local;
  uint compressed_local;
  
  fVar4 = deFloatPow(2.0,(float)numMantissaBits);
  uVar2 = (ulong)fVar4;
  mantissa = 0;
  uVar1 = compressed / (uint)uVar2;
  uVar3 = compressed % (uint)uVar2;
  if ((uVar1 == 0) && (uVar3 == 0)) {
    mantissa = 0;
  }
  else if ((uVar1 == 0) && (uVar3 != 0)) {
    fVar4 = deFloatPow(2.0,-14.0);
    mantissa = (uint)(fVar4 * ((float)uVar3 / (float)(uVar2 & 0xffffffff)));
  }
  else if ((uVar1 == 0) || (0x1e < uVar1)) {
    if ((uVar1 == 0x1f) && (uVar3 == 0)) {
      mantissa = 0x7f800000;
    }
    else if ((uVar1 == 0x1f) && (uVar3 != 0)) {
      mantissa = 0x7fc00000;
    }
  }
  else {
    fVar4 = deFloatPow(2.0,(float)uVar1 + -15.0);
    mantissa = (uint)(fVar4 * ((float)uVar3 / (float)(uVar2 & 0xffffffff) + 1.0));
  }
  return (float)mantissa;
}

Assistant:

float expandFloat(const unsigned int compressed, const unsigned int numMantissaBits)
{
	unsigned int divisor = (unsigned int)deFloatPow(2, (float)numMantissaBits);
	float		 retval  = 0.0;
	unsigned int exponent, mantissa;

	exponent = compressed / divisor;
	mantissa = compressed % divisor;
	if (exponent == 0 && mantissa == 0)
		retval = 0.0;
	else if (exponent == 0 && mantissa != 0)
		retval = deFloatPow(2.f, -14.f) * ((float)mantissa / (float)divisor);
	else if (0 < exponent && exponent < 31)
		retval = deFloatPow(2.f, (float)exponent - 15.f) * (1.f + (float)mantissa / (float)divisor);
	else if (exponent == 31 && mantissa == 0)
		retval = INFINITY;
	else if (exponent == 31 && mantissa != 0)
		retval = NAN;
	else
		DE_ASSERT(DE_FALSE && "Invalid exponent and mantissa");

	return retval;
}